

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cli_utils.cc
# Opt level: O0

int parseFilterArguments(int argc,char **argv,DeviceFilter *filter)

{
  int iVar1;
  int iVar2;
  invalid_argument *piVar3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this;
  long in_RDX;
  int in_EDI;
  string p;
  value_type *in_stack_fffffffffffffe78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffe80;
  allocator<char> *in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffebc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec8;
  string local_110 [32];
  string local_f0 [32];
  string local_d0 [32];
  string local_b0 [32];
  string local_90 [32];
  string local_70 [39];
  allocator<char> local_49;
  string local_48 [48];
  long local_18;
  
  if (in_EDI == 0) {
    piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar3,"-f expects an option");
    __cxa_throw(piVar3,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  local_18 = in_RDX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffec0,
             (char *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
             in_stack_fffffffffffffeb0);
  std::allocator<char>::~allocator(&local_49);
  iVar1 = std::__cxx11::string::compare((ulong)local_48,0,(char *)0x5);
  if (iVar1 == 0) {
    std::__cxx11::string::substr((ulong)local_70,(ulong)local_48);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
    std::__cxx11::string::~string(local_70);
  }
  else {
    iVar2 = std::__cxx11::string::compare((ulong)local_48,0,(char *)0x7);
    if (iVar2 == 0) {
      std::__cxx11::string::substr((ulong)local_90,(ulong)local_48);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
      std::__cxx11::string::~string(local_90);
    }
    else {
      iVar2 = std::__cxx11::string::compare((ulong)local_48,0,(char *)0x4);
      if (iVar2 == 0) {
        std::__cxx11::string::substr((ulong)local_b0,(ulong)local_48);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
        std::__cxx11::string::~string(local_b0);
      }
      else {
        iVar2 = std::__cxx11::string::compare((ulong)local_48,0,(char *)0x6);
        if (iVar2 == 0) {
          std::__cxx11::string::substr((ulong)local_d0,(ulong)local_48);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
          std::__cxx11::string::~string(local_d0);
        }
        else {
          iVar2 = std::__cxx11::string::compare((ulong)local_48,0,(char *)0x6);
          if (iVar2 != 0) {
            piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
            std::operator+((char *)CONCAT44(iVar1,in_stack_fffffffffffffec8),
                           in_stack_fffffffffffffec0);
            std::invalid_argument::invalid_argument(piVar3,local_110);
            __cxa_throw(piVar3,&std::invalid_argument::typeinfo,
                        std::invalid_argument::~invalid_argument);
          }
          this = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(local_18 + 0x60);
          std::__cxx11::string::substr((ulong)local_f0,(ulong)local_48);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(this,in_stack_fffffffffffffe78);
          std::__cxx11::string::~string(local_f0);
        }
      }
    }
  }
  std::__cxx11::string::~string(local_48);
  return 1;
}

Assistant:

int parseFilterArguments(int argc, char **argv, DeviceFilter &filter)
{
  if (argc == 0)
  {
    throw std::invalid_argument("-f expects an option");
  }

  const std::string p = argv[0];

  if (p.compare(0, 5, "name=") == 0)
  {
    filter.name.push_back(p.substr(5));
  }
  else if (p.compare(0, 7, "serial=") == 0)
  {
    filter.serial.push_back(p.substr(7));
  }
  else if (p.compare(0, 4, "mac=") == 0)
  {
    filter.mac.push_back(p.substr(4));
  }
  else if (p.compare(0, 6, "iface=") == 0)
  {
    filter.iface.push_back(p.substr(6));
  }
  else if (p.compare(0, 6, "model=") == 0)
  {
    filter.model.push_back(p.substr(6));
  }
  else
  {
    throw std::invalid_argument("Unknown option for parameter -f: " + p);
  }

  return 1;
}